

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double calc_kurtosis<double>
                 (size_t nrows,int *x,int ncat,size_t *buffer_cnt,double *buffer_prob,
                 MissingAction missing_action,CategSplit cat_split_type,Xoshiro256PP *rnd_generator)

{
  long in_RCX;
  long lVar1;
  int in_EDX;
  long in_RSI;
  ulong in_RDI;
  int in_R9D;
  double dVar2;
  size_t row_1;
  size_t row;
  double *in_stack_00000028;
  size_t cnt;
  Xoshiro256PP *in_stack_00000068;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  unsigned_long *in_stack_ffffffffffffffa0;
  undefined8 local_50;
  undefined8 local_48;
  
  std::fill<unsigned_long*,unsigned_long>
            (in_stack_ffffffffffffffa0,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (unsigned_long *)0x1ea1f1);
  if (in_R9D == 0) {
    for (local_48 = 0; local_48 < in_RDI; local_48 = local_48 + 1) {
      lVar1 = (long)*(int *)(in_RSI + local_48 * 4);
      *(long *)(in_RCX + lVar1 * 8) = *(long *)(in_RCX + lVar1 * 8) + 1;
    }
  }
  else {
    for (local_50 = 0; local_50 < in_RDI; local_50 = local_50 + 1) {
      if (*(int *)(in_RSI + local_50 * 4) < 0) {
        *(long *)(in_RCX + (long)in_EDX * 8) = *(long *)(in_RCX + (long)in_EDX * 8) + 1;
      }
      else {
        lVar1 = (long)*(int *)(in_RSI + local_50 * 4);
        *(long *)(in_RCX + lVar1 * 8) = *(long *)(in_RCX + lVar1 * 8) + 1;
      }
    }
  }
  dVar2 = calc_kurtosis_internal<double>
                    ((size_t)buffer_cnt,(int *)buffer_prob,missing_action,(size_t *)cnt,
                     in_stack_00000028,row._4_4_,(CategSplit)nrows,in_stack_00000068);
  return dVar2;
}

Assistant:

double calc_kurtosis(size_t nrows, int x[], int ncat, size_t buffer_cnt[], double buffer_prob[],
                     MissingAction missing_action, CategSplit cat_split_type, RNG_engine &rnd_generator)
{
    size_t cnt = nrows;
    std::fill(buffer_cnt, buffer_cnt + ncat + 1, (size_t)0);

    if (missing_action == Fail)
    {
        for (size_t row = 0; row < nrows; row++)
            buffer_cnt[x[row]]++;
    }

    else
    {
        for (size_t row = 0; row < nrows; row++)
        {
            if (likely(x[row] >= 0))
                buffer_cnt[x[row]]++;
            else
                buffer_cnt[ncat]++;
        }
    }

    return calc_kurtosis_internal<ldouble_safe>(
                                  cnt, x, ncat, buffer_cnt, buffer_prob,
                                  missing_action, cat_split_type, rnd_generator);
}